

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O3

void __thiscall chrono::ChParticleCloud::ArchiveOUT(ChParticleCloud *this,ChArchiveOut *marchive)

{
  ChNameValue<std::vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>_> local_38;
  
  ChArchiveOut::VersionWrite<chrono::ChParticleCloud>(marchive);
  ChIndexedParticles::ArchiveOUT(&this->super_ChIndexedParticles,marchive);
  local_38._value = &this->particles;
  local_38._name = "particles";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChAparticle*>(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)
       &this->particle_collision_model;
  local_38._name = "particle_collision_model";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::collision::ChCollisionModel>
            (marchive,(ChNameValue<chrono::collision::ChCollisionModel_*> *)&local_38);
  local_38._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->matsurface;
  local_38._name = "matsurface";
  local_38._flags = '\0';
  ChArchiveOut::out<chrono::ChMaterialSurface>
            (marchive,(ChNameValue<std::shared_ptr<chrono::ChMaterialSurface>_> *)&local_38);
  local_38._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->do_collide;
  local_38._name = "do_collide";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)
       &this->do_limit_speed;
  local_38._name = "do_limit_speed";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[2])(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->max_speed;
  local_38._name = "max_speed";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->max_wvel;
  local_38._name = "max_wvel";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->sleep_time;
  local_38._name = "sleep_time";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)
       &this->sleep_minspeed;
  local_38._name = "sleep_minspeed";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)&this->sleep_minwvel
  ;
  local_38._name = "sleep_minwvel";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  local_38._value =
       (vector<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_> *)
       &this->sleep_starttime;
  local_38._name = "sleep_starttime";
  local_38._flags = '\0';
  (*(marchive->super_ChArchive)._vptr_ChArchive[5])(marchive,&local_38);
  return;
}

Assistant:

void ChParticleCloud::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChParticleCloud>();

    // serialize parent class
    ChIndexedParticles::ArchiveOUT(marchive);

    // serialize all member data:
    marchive << CHNVP(particles);
    // marchive << CHNVP(particle_mass); //***TODO***
    marchive << CHNVP(particle_collision_model);
    marchive << CHNVP(matsurface);
    marchive << CHNVP(do_collide);
    marchive << CHNVP(do_limit_speed);
    marchive << CHNVP(max_speed);
    marchive << CHNVP(max_wvel);
    marchive << CHNVP(sleep_time);
    marchive << CHNVP(sleep_minspeed);
    marchive << CHNVP(sleep_minwvel);
    marchive << CHNVP(sleep_starttime);
}